

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O0

void __thiscall
cmMakefileProfilingData::RAII::RAII
          (RAII *this,cmMakefileProfilingData *data,string *category,string *name,
          optional<Json::Value> *args)

{
  cmMakefileProfilingData *this_00;
  optional<Json::Value> local_60;
  optional<Json::Value> *local_30;
  optional<Json::Value> *args_local;
  string *name_local;
  string *category_local;
  cmMakefileProfilingData *data_local;
  RAII *this_local;
  
  this->Data = data;
  this_00 = this->Data;
  local_30 = args;
  args_local = (optional<Json::Value> *)name;
  name_local = category;
  category_local = (string *)data;
  data_local = (cmMakefileProfilingData *)this;
  std::optional<Json::Value>::optional(&local_60,args);
  StartEntry(this_00,category,name,&local_60);
  std::optional<Json::Value>::~optional(&local_60);
  return;
}

Assistant:

cmMakefileProfilingData::RAII::RAII(cmMakefileProfilingData& data,
                                    const std::string& category,
                                    const std::string& name,
                                    cm::optional<Json::Value> args)
  : Data(&data)
{
  this->Data->StartEntry(category, name, std::move(args));
}